

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

int ini_find_property(ini_t *ini,int section,char *name,int name_length)

{
  ini_internal_property_t *piVar1;
  int iVar2;
  ulong uVar3;
  char *__s2;
  int iVar4;
  ulong uVar5;
  
  if ((((-1 < section) && (ini != (ini_t *)0x0)) && (name != (char *)0x0)) &&
     (section < ini->section_count)) {
    if (name_length < 1) {
      name_length = sx_strlen(name);
    }
    uVar5 = 0;
    uVar3 = (ulong)(uint)ini->property_capacity;
    if (ini->property_capacity < 1) {
      uVar3 = uVar5;
    }
    iVar4 = 0;
    for (; uVar3 * 0x78 - uVar5 != 0; uVar5 = uVar5 + 0x78) {
      piVar1 = ini->properties;
      if (*(int *)(piVar1->name + (uVar5 - 4)) == section) {
        __s2 = *(char **)(piVar1->value + (uVar5 - 8));
        if (*(char **)(piVar1->value + (uVar5 - 8)) == (char *)0x0) {
          __s2 = piVar1->name + uVar5;
        }
        iVar2 = strncasecmp(name,__s2,(long)name_length);
        if (iVar2 == 0) {
          return iVar4;
        }
        iVar4 = iVar4 + 1;
      }
    }
  }
  return -1;
}

Assistant:

int ini_find_property( ini_t const* ini, int section, char const* name, int name_length )
    {
    int i;
    int c;

    if( ini && name && section >= 0 && section < ini->section_count)
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        c = 0;
        for( i = 0; i < ini->property_capacity; ++i )
            {
            if( ini->properties[ i ].section == section )
                {
                char const* const other = 
                    ini->properties[ i ].name_large ? ini->properties[ i ].name_large : ini->properties[ i ].name;
                if( INI_STRNICMP( name, other, name_length ) == 0 )
                    return c;
                ++c;
                }
            }
        }

    return INI_NOT_FOUND;
    }